

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_portal.cpp
# Opt level: O3

void __thiscall GLEEHorizonPortal::DrawContents(GLEEHorizonPortal *this)

{
  sector_t *this_00;
  FDynamicColormap *pFVar1;
  uint uVar2;
  uint uVar3;
  GLSkyInfo skyinfo;
  GLHorizonPortal ceil;
  GLHorizonInfo local_158;
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  GLHorizonPortal local_e0;
  
  this_00 = this->portal->mOrigin;
  if ((this_00->planes[0].Texture.texnum == skyflatnum.texnum) ||
     (local_158.plane.texture.texnum = this_00->planes[1].Texture.texnum,
     local_158.plane.texture.texnum == skyflatnum.texnum)) {
    GLSkyInfo::init((GLSkyInfo *)&local_158,(EVP_PKEY_CTX *)(ulong)(uint)this_00->sky);
    local_e0.super_GLPortal.lines.Array = (GLWall *)0x0;
    local_e0.super_GLPortal.lines.Most = 0;
    local_e0.super_GLPortal.lines.Count = 0;
    local_e0.super_GLPortal.mPrimIndices.Array = (uint *)0x0;
    local_e0.super_GLPortal.mPrimIndices.Most = 0;
    local_e0.super_GLPortal.mPrimIndices.Count = 0;
    local_e0.super_GLPortal.savedmapsection.Array = (uchar *)0x0;
    local_e0.super_GLPortal.savedmapsection.Most = 0;
    local_e0.super_GLPortal.savedmapsection.Count = 0;
    local_e0.super_GLPortal._vptr_GLPortal = (_func_int **)&PTR__GLPortal_0086a188;
    local_e0.origin = &local_158;
    GLSkyPortal::DrawContents((GLSkyPortal *)&local_e0);
    GLPortal::~GLPortal(&local_e0.super_GLPortal);
    local_158.plane.texture.texnum = this_00->planes[1].Texture.texnum;
  }
  if (local_158.plane.texture.texnum != skyflatnum.texnum) {
    local_158.plane.Scale.Y = (float)this_00->planes[1].xform.yScale;
    local_158.plane.Scale.X = (float)this_00->planes[1].xform.xScale;
    local_158.plane.plane.normal.Z = (this_00->ceilingplane).normal.Z;
    local_158.plane.plane.normal.X = (this_00->ceilingplane).normal.X;
    local_158.plane.plane.normal.Y = (this_00->ceilingplane).normal.Y;
    local_158.plane.plane.D = (this_00->ceilingplane).D;
    local_158.plane.plane.negiC = (this_00->ceilingplane).negiC;
    local_158.plane.Offs.X = (float)this_00->planes[1].xform.xOffs;
    local_158.plane.Offs.Y =
         (float)(this_00->planes[1].xform.baseyOffs + this_00->planes[1].xform.yOffs);
    local_158.plane.Texheight = (float)local_158.plane.plane.D;
    local_158.plane.Angle =
         (float)(this_00->planes[1].xform.Angle.Degrees + this_00->planes[1].xform.baseAngle.Degrees
                );
    local_f8._4_4_ = local_158.plane.Angle;
    local_f8._0_4_ = local_158.plane.Texheight;
    fStack_f0 = local_158.plane.Offs.X;
    fStack_ec = local_158.plane.Offs.Y;
    uVar2 = sector_t::GetCeilingLight(this_00);
    uVar3 = 0xff;
    if (uVar2 < 0xff) {
      uVar3 = uVar2;
    }
    local_158.lightlevel = 0;
    if (0 < (int)uVar2) {
      local_158.lightlevel = uVar3;
    }
    pFVar1 = this_00->ColorMap;
    local_158.colormap.LightColor.field_0 =
         (anon_union_4_2_12391d7c_for_PalEntry_0)(pFVar1->Color).field_0.d;
    local_158.colormap.desaturation = pFVar1->Desaturate;
    local_158.colormap.FadeColor.field_0 = (pFVar1->Fade).field_0;
    local_158.colormap.blendfactor = (uint)local_158.colormap.LightColor.field_0 >> 0x18;
    if (this->portal->mType == 4) {
      local_158.plane.Texheight = (float)((double)ABS((float)local_f8._0_4_) + ViewPos.Z);
    }
    GLHorizonPortal::GLHorizonPortal(&local_e0,&local_158,true);
    GLHorizonPortal::DrawContents(&local_e0);
    GLPortal::~GLPortal(&local_e0.super_GLPortal);
  }
  local_158.plane.texture.texnum = this_00->planes[0].Texture.texnum;
  if (local_158.plane.texture.texnum != skyflatnum.texnum) {
    local_158.plane.Offs.Y =
         (float)(this_00->planes[0].xform.baseyOffs + this_00->planes[0].xform.yOffs);
    local_158.plane.Angle =
         (float)(this_00->planes[0].xform.Angle.Degrees + this_00->planes[0].xform.baseAngle.Degrees
                );
    local_158.plane.Offs.X = (float)this_00->planes[0].xform.xOffs;
    local_158.plane.Scale.Y = (float)this_00->planes[0].xform.yScale;
    local_158.plane.Scale.X = (float)this_00->planes[0].xform.xScale;
    local_158.plane.plane.normal.Z = (this_00->floorplane).normal.Z;
    local_158.plane.plane.normal.X = (this_00->floorplane).normal.X;
    local_158.plane.plane.normal.Y = (this_00->floorplane).normal.Y;
    local_158.plane.plane.D = (this_00->floorplane).D;
    local_158.plane.plane.negiC = (this_00->floorplane).negiC;
    _local_f8 = ZEXT416((uint)(float)local_158.plane.plane.D);
    local_158.plane.Texheight = -(float)local_158.plane.plane.D;
    uVar2 = sector_t::GetFloorLight(this_00);
    uVar3 = 0xff;
    if (uVar2 < 0xff) {
      uVar3 = uVar2;
    }
    local_158.lightlevel = 0;
    if (0 < (int)uVar2) {
      local_158.lightlevel = uVar3;
    }
    pFVar1 = this_00->ColorMap;
    local_158.colormap.LightColor.field_0 =
         (anon_union_4_2_12391d7c_for_PalEntry_0)(pFVar1->Color).field_0.d;
    local_158.colormap.desaturation = pFVar1->Desaturate;
    local_158.colormap.FadeColor.field_0 = (pFVar1->Fade).field_0;
    local_158.colormap.blendfactor = (uint)local_158.colormap.LightColor.field_0 >> 0x18;
    if (this->portal->mType == 4) {
      local_158.plane.Texheight = (float)(ViewPos.Z - (double)ABS((float)local_f8._0_4_));
    }
    GLHorizonPortal::GLHorizonPortal(&local_e0,&local_158,true);
    GLHorizonPortal::DrawContents(&local_e0);
    GLPortal::~GLPortal(&local_e0.super_GLPortal);
  }
  return;
}

Assistant:

void GLEEHorizonPortal::DrawContents()
{
	PortalAll.Clock();
	sector_t *sector = portal->mOrigin;
	if (sector->GetTexture(sector_t::floor) == skyflatnum ||
		sector->GetTexture(sector_t::ceiling) == skyflatnum)
	{
		GLSkyInfo skyinfo;
		skyinfo.init(sector->sky, 0);
		GLSkyPortal sky(&skyinfo, true);
		sky.DrawContents();
	}
	if (sector->GetTexture(sector_t::ceiling) != skyflatnum)
	{
		GLHorizonInfo horz;
		horz.plane.GetFromSector(sector, true);
		horz.lightlevel = gl_ClampLight(sector->GetCeilingLight());
		horz.colormap = sector->ColorMap;
		if (portal->mType == PORTS_PLANE)
		{
			horz.plane.Texheight = ViewPos.Z + fabs(horz.plane.Texheight);
		}
		GLHorizonPortal ceil(&horz, true);
		ceil.DrawContents();
	}
	if (sector->GetTexture(sector_t::floor) != skyflatnum)
	{
		GLHorizonInfo horz;
		horz.plane.GetFromSector(sector, false);
		horz.lightlevel = gl_ClampLight(sector->GetFloorLight());
		horz.colormap = sector->ColorMap;
		if (portal->mType == PORTS_PLANE)
		{
			horz.plane.Texheight = ViewPos.Z - fabs(horz.plane.Texheight);
		}
		GLHorizonPortal floor(&horz, true);
		floor.DrawContents();
	}



}